

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::WorkerThread(HdlcAnalyzer *this)

{
  SetupAnalyzer(this);
  if (((this->mSettings)._M_ptr)->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    ProcessHDLCFrame(this);
    CommitFrames(this);
    std::vector<Frame,_std::allocator<Frame>_>::clear(&this->mResultFrames);
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void HdlcAnalyzer::WorkerThread()
{
    SetupAnalyzer();

    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        // Synchronize
        mHdlc->AdvanceToNextEdge();
    }

    // Main loop
    for( ;; )
    {
        ProcessHDLCFrame();

        CommitFrames();
        mResultFrames.clear();

        mResults->CommitResults();
        ReportProgress( mHdlc->GetSampleNumber() );
        CheckIfThreadShouldExit();
    }
}